

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

Result __thiscall
tonk::Connection::InitializeOutgoingConnection
          (Connection *this,Dependencies *deps,TonkSocketConfig *socketConfig,
          TonkConnectionConfig *connectionConfig,char *serverHostname,uint16_t serverPort)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  pointer pHVar4;
  long lVar5;
  undefined8 in_RCX;
  long in_RSI;
  ErrorResult *in_RDI;
  void *in_R8;
  char *in_R9;
  undefined1 uVar6;
  uint16_t in_stack_00000008;
  uint8_t keyBytes [8];
  Result *result;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  Dependencies *in_stack_fffffffffffff7b8;
  SessionOutgoing *in_stack_fffffffffffff7c0;
  string *in_stack_fffffffffffff7c8;
  basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>
  *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  Connection *in_stack_fffffffffffff7e0;
  io_context *in_stack_fffffffffffff7e8;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  OutputWorker *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  uint32_t in_stack_fffffffffffff80c;
  Connection *in_stack_fffffffffffff810;
  Connection *in_stack_fffffffffffff830;
  undefined8 in_stack_fffffffffffff838;
  uint bytes;
  uint8_t *in_stack_fffffffffffff840;
  Connection *in_stack_fffffffffffff8a8;
  string local_718 [95];
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  undefined1 local_690 [6];
  uint16_t in_stack_fffffffffffff976;
  string *in_stack_fffffffffffff978;
  undefined8 local_680 [3];
  char *local_668 [2];
  allocator local_651;
  string local_650 [32];
  string local_630 [55];
  undefined1 local_5f9;
  char *local_5f8;
  void *local_5f0;
  undefined8 local_5e8;
  long local_588;
  long local_580;
  undefined1 *local_568;
  undefined1 *local_558;
  char **local_548;
  undefined8 *local_520;
  char *local_518;
  Connection *local_510;
  string *local_508;
  char *local_500;
  long local_4f8;
  char *local_4f0;
  undefined4 local_4e4;
  Connection *local_4e0;
  undefined4 local_4d4;
  Connection *local_4d0;
  undefined1 local_4b8 [16];
  ostream aoStack_4a8 [376];
  char *local_330;
  undefined4 local_324;
  Connection *local_320;
  char *local_318;
  mutex *local_310;
  undefined1 *local_308;
  Connection *local_300;
  mutex *local_2f8;
  undefined1 *local_2f0;
  Connection *local_2e8;
  mutex *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  Connection *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  long local_290;
  undefined4 local_284;
  long local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  long local_c8;
  string *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  long local_a0;
  string *local_98;
  undefined1 *local_90;
  long local_88;
  string *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  long local_58;
  string *local_50;
  undefined1 *local_48;
  long local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  long local_18;
  char *local_10;
  undefined1 *local_8;
  char *pcVar7;
  
  bytes = (uint)((ulong)in_stack_fffffffffffff838 >> 0x20);
  local_5f9 = 0;
  in_RDI->Source = (char *)0x0;
  local_5f8 = in_R9;
  local_5f0 = in_R8;
  local_5e8 = in_RCX;
  Dependencies::operator=((Dependencies *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  *(undefined8 *)(in_RSI + 0xe0) = local_5e8;
  memcpy((void *)(in_RSI + 0xe8),local_5f0,0x28);
  local_580 = *(long *)(in_RSI + 0x70);
  std::__atomic_base<int>::operator++((__atomic_base<int> *)(local_580 + 0x28));
  pcVar1 = local_5f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,pcVar1,&local_651);
  pcVar1 = pcVar7;
  in_stack_fffffffffffff976 = (uint16_t)((ulong)pcVar7 >> 0x30);
  GetConnectionLogPrefix(in_stack_fffffffffffff978,in_stack_fffffffffffff976);
  pcVar7 = pcVar1;
  logger::Channel::SetPrefix((Channel *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff7c0);
  MakeUniqueNoThrow<asio::io_context::strand,asio::io_context&>(in_stack_fffffffffffff7e8);
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  operator=((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *)
            in_stack_fffffffffffff7c0,
            (unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *)
            in_stack_fffffffffffff7b8);
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  ~unique_ptr((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
               *)in_stack_fffffffffffff7c0);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
                      *)0x19fd96);
  if (bVar2) {
    MakeUniqueNoThrow<tonk::HostnameResolverState>();
    std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::operator=((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                 *)in_stack_fffffffffffff7c0,
                (unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                 *)in_stack_fffffffffffff7b8);
    std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::~unique_ptr((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                   *)in_stack_fffffffffffff7c0);
    pHVar4 = std::
             unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
             ::operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                           *)0x19ff0e);
    pHVar4->ServerUDPPort = in_stack_00000008;
    std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff7c0);
    MakeUniqueNoThrow<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>,asio::io_context&>
              (in_stack_fffffffffffff7e8);
    std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x19ff53);
    std::
    unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::operator=((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                 *)in_stack_fffffffffffff7c0,
                (unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                 *)in_stack_fffffffffffff7b8);
    std::
    unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::~unique_ptr((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                   *)in_stack_fffffffffffff7c0);
    SecureRandom_Next(in_stack_fffffffffffff840,bytes);
    local_558 = &stack0xfffffffffffff978;
    in_RDI->Source = (char *)in_stack_fffffffffffff978;
    Result::~Result((Result *)in_stack_fffffffffffff7c0);
    if (in_RDI->Source == (char *)0x0) {
      local_520 = local_680;
      *(undefined8 *)(in_RSI + 0xc8f8) = local_680[0];
      initSubsystems(in_stack_fffffffffffff8a8);
      local_568 = local_690;
      in_RDI->Source = pcVar7;
      Result::~Result((Result *)in_stack_fffffffffffff7c0);
      if (in_RDI->Source == (char *)0x0) {
        SessionOutgoing::StartHandshakeC2SConnect
                  (in_stack_fffffffffffff7c0,(uint64_t)in_stack_fffffffffffff7b8);
        resetTimers(in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    SUB41((uint)in_stack_fffffffffffff808 >> 0x18,0));
        if ((InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
             ::kAnyProtocolStr_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                                         ::kAnyProtocolStr_abi_cxx11_), iVar3 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)
                     InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                     ::kAnyProtocolStr_abi_cxx11_,"",&local_691);
          std::allocator<char>::~allocator((allocator<char> *)&local_691);
          __cxa_atexit(std::__cxx11::string::~string,
                       InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                       ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                               ::kAnyProtocolStr_abi_cxx11_);
        }
        local_588 = in_RSI + 8;
        std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RSI + 0x30));
        std::
        unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
        operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                    *)0x1a01ea);
        std::
        unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
        ::operator->((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                      *)0x1a01f6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6b8,local_5f8,&local_6b9);
        asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>::
        async_resolve<tonk::Connection::InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)::__0>
                  (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                   (string *)in_stack_fffffffffffff7c0,
                   (anon_class_8_1_8991fb9c *)in_stack_fffffffffffff7b8);
        std::__cxx11::string::~string(local_6b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
        bVar2 = ConnectionIdMap::InsertAndAssignId
                          ((ConnectionIdMap *)in_stack_fffffffffffff810,
                           (id_t *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                           (IConnection *)in_stack_fffffffffffff800);
        if (!bVar2) {
          local_510 = (Connection *)(in_RSI + 0x110);
          local_518 = "Failed to insert new connection into map";
          local_4e4 = 3;
          local_4f0 = "Failed to insert new connection into map";
          local_4d4 = 3;
          local_4e0 = local_510;
          local_4d0 = local_510;
          if (*(int *)(in_RSI + 0x118) < 4) {
            local_324 = 3;
            local_330 = "Failed to insert new connection into map";
            in_stack_fffffffffffff830 = local_510;
            local_320 = local_510;
            logger::LogStringBuffer::LogStringBuffer
                      ((LogStringBuffer *)in_stack_fffffffffffff7c0,
                       (char *)in_stack_fffffffffffff7b8,Trace);
            local_310 = &(in_stack_fffffffffffff830->super_IConnection).SelfRefCount.ShutdownLock;
            local_308 = local_4b8;
            local_318 = local_330;
            local_300 = in_stack_fffffffffffff830;
            local_2f8 = local_310;
            local_2f0 = local_308;
            local_2e8 = in_stack_fffffffffffff830;
            local_2e0 = local_310;
            local_2d8 = local_308;
            std::operator<<(aoStack_4a8,(string *)local_310);
            local_2c8 = local_308;
            local_2d0 = local_318;
            local_2b0 = local_308;
            local_2b8 = local_318;
            local_2c0 = in_stack_fffffffffffff830;
            std::operator<<((ostream *)(local_308 + 0x10),local_318);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write
                      (in_stack_fffffffffffff800,
                       (LogStringBuffer *)
                       CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a053d);
          }
        }
        postNextTimer(in_stack_fffffffffffff7e0);
      }
    }
  }
  else {
    Result::OutOfMemory();
    local_548 = local_668;
    in_RDI->Source = local_668[0];
    local_668[0] = (char *)0x0;
    Result::~Result((Result *)in_stack_fffffffffffff7c0);
  }
  uVar6 = in_RDI->Source != (char *)0x0;
  if ((bool)uVar6) {
    lVar5 = in_RSI + 0x110;
    Result::ToJson_abi_cxx11_((Result *)in_stack_fffffffffffff7e8);
    local_500 = "Connection::InitializeOutgoingConnection failed: ";
    local_508 = local_718;
    local_294 = 3;
    local_2a0 = "Connection::InitializeOutgoingConnection failed: ";
    local_284 = 3;
    local_4f8 = lVar5;
    local_2a8 = local_508;
    local_290 = lVar5;
    local_280 = lVar5;
    if (*(int *)(in_RSI + 0x118) < 4) {
      local_cc = 3;
      local_d8 = "Connection::InitializeOutgoingConnection failed: ";
      local_e0 = local_508;
      local_c8 = lVar5;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8,
                 Trace);
      local_b0 = (string *)(lVar5 + 0x38);
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_a0 = lVar5;
      local_98 = local_b0;
      local_90 = local_a8;
      local_88 = lVar5;
      local_80 = local_b0;
      local_78 = local_a8;
      std::operator<<(aoStack_258,local_b0);
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_20 = local_a8;
      local_28 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      local_58 = lVar5;
      local_18 = lVar5;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_48 = local_60;
      local_50 = local_70;
      local_30 = local_60;
      local_38 = local_70;
      local_40 = lVar5;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                (in_stack_fffffffffffff800,
                 (LogStringBuffer *)CONCAT17(uVar6,in_stack_fffffffffffff7f8));
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a0ae4);
    }
    std::__cxx11::string::~string(local_718);
    Shutdown(in_stack_fffffffffffff830);
  }
  return (Result)in_RDI;
}

Assistant:

Result Connection::InitializeOutgoingConnection(
    const Dependencies& deps,
    const TonkSocketConfig* socketConfig,
    const TonkConnectionConfig& connectionConfig,
    const char* serverHostname,
    uint16_t serverPort)
{
    Result result;

    try
    {
        Deps = deps;
        SocketConfig = socketConfig;
        ConnectionConfig = connectionConfig;

        // Add reference to socket
        Deps.SocketRefCount->IncrementReferences();

        Logger.SetPrefix(GetConnectionLogPrefix(serverHostname, serverPort));

        AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Deps.Context);
        if (!AsioEventStrand)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        ResolverState = MakeUniqueNoThrow<HostnameResolverState>();
        ResolverState->ServerUDPPort = serverPort;
        ResolverState->Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Deps.Context);

#ifdef TONK_DISABLE_OUTGOING_ENCRYPTION
        EncryptionKey = 0;
#else // TONK_DISABLE_OUTGOING_ENCRYPTION
        uint8_t keyBytes[8];
        result = SecureRandom_Next(keyBytes, 8);
        if (result.IsFail()) {
            goto OnError;
        }
        EncryptionKey = siamese::ReadU64_LE(keyBytes);
#endif // TONK_DISABLE_OUTGOING_ENCRYPTION

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Start attaching handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(EncryptionKey);

        // Initialize timers for outgoing connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, false);

        //----------------------------------------------------------------------
        // Connection creation cannot fail past this point
        //----------------------------------------------------------------------

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        // Kick off async resolve after initialization
        SelfRefCount.IncrementReferences();
        ResolverState->Resolver->async_resolve(serverHostname, kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            onResolve(error, results);
            SelfRefCount.DecrementReferences();
        });

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("Failed to insert new connection into map");
        }

        postNextTimer();

        /*
            Do not immediately flush queued messages - The application decides
            when to flush the initial data so that it can be included in the
            first connection request datagram to the server.
        */
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::InitializeOutgoingConnection", "Exception!", ErrorType::Tonk);
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::InitializeOutgoingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}